

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

Value * __thiscall
ot::commissioner::Interpreter::ProcessSessionIdJob
          (Value *__return_storage_ptr__,Interpreter *this,CommissionerAppPtr *aCommissioner,
          Expression *param_2)

{
  ErrorCode EVar1;
  element_type *peVar2;
  Value *pVVar3;
  uint16_t sessionId;
  ushort local_aa;
  string local_a8;
  undefined1 local_88 [40];
  Value local_60;
  
  (__return_storage_ptr__->mError).mCode = kNone;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  peVar2 = (aCommissioner->
           super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  (*(peVar2->super_CommissionerHandler)._vptr_CommissionerHandler[0x12])(local_88,peVar2,&local_aa);
  Value::Value(&local_60,(Error *)local_88);
  pVVar3 = Value::operator=(__return_storage_ptr__,&local_60);
  EVar1 = (pVVar3->mError).mCode;
  Value::~Value(&local_60);
  std::__cxx11::string::~string((string *)(local_88 + 8));
  if (EVar1 == kNone) {
    std::__cxx11::to_string(&local_a8,(uint)local_aa);
    Value::Value(&local_60,&local_a8);
    Value::operator=(__return_storage_ptr__,&local_60);
    Value::~Value(&local_60);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessSessionIdJob(CommissionerAppPtr &aCommissioner, const Expression &)
{
    Value    value;
    uint16_t sessionId;

    SuccessOrExit(value = aCommissioner->GetSessionId(sessionId));
    value = std::to_string(sessionId);

exit:
    return value;
}